

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O0

void FAudio_PlatformInit(FAudio *audio,uint32_t flags,uint32_t deviceIndex,
                        FAudioWaveFormatExtensible *mixFormat,uint32_t *updateSize,
                        void **platformDevice)

{
  code *pcVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  FAudioGUID *subformat;
  long lVar5;
  long in_RCX;
  int in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  uint *in_R8;
  ulong *in_R9;
  SDL_AssertState sdl_assert_state_2;
  char *err;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  int changes;
  char *driver;
  SDL_AudioSpec have;
  SDL_AudioSpec want;
  SDL_AudioDeviceID device;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  FAudioWaveFormatExtensible *in_stack_ffffffffffffff70;
  undefined4 local_7c;
  undefined1 local_70 [8];
  ushort local_68;
  int local_50;
  undefined2 local_4c;
  undefined1 local_4a;
  undefined1 local_49;
  short local_48;
  code *local_40;
  undefined8 local_38;
  uint local_2c;
  ulong *local_28;
  uint *local_20;
  long local_18;
  int local_10;
  uint local_c;
  undefined8 local_8;
  
  local_7c = 0;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_18 != 0) goto LAB_00135921;
    iVar3 = SDL_ReportAssertion(&FAudio_PlatformInit::sdl_assert_data,"FAudio_PlatformInit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_platform_sdl2.c"
                                ,0x57);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_00135921:
  do {
    if (local_20 != (uint *)0x0) goto LAB_0013596d;
    iVar3 = SDL_ReportAssertion(&FAudio_PlatformInit::sdl_assert_data_1,"FAudio_PlatformInit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_platform_sdl2.c"
                                ,0x58);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_0013596d:
  local_50 = *(int *)(local_18 + 4);
  local_4c = 0x8120;
  local_4a = (undefined1)*(undefined2 *)(local_18 + 2);
  local_49 = 0;
  local_40 = FAudio_INTERNAL_MixCallback;
  local_38 = local_8;
  if ((local_c & 0x8000) == 0) {
    local_48 = (short)(local_50 / 100);
  }
  else {
    local_48 = (short)(int)((double)local_50 / 46.875);
  }
  uVar4 = SDL_GetCurrentAudioDriver();
  iVar3 = SDL_strcmp(uVar4,"pulseaudio");
  if (iVar3 == 0) {
    local_48 = local_48 << 1;
    local_7c = 8;
  }
  else {
    iVar3 = SDL_strcmp(uVar4,"emscripten");
    if ((iVar3 == 0) || (iVar3 = SDL_strcmp(uVar4,"dsp"), iVar3 == 0)) {
      uVar2 = local_48 - 1U | (ushort)((int)(uint)(ushort)(local_48 - 1U) >> 1);
      uVar2 = uVar2 | (ushort)((int)(uint)uVar2 >> 2);
      uVar2 = uVar2 | (ushort)((int)(uint)uVar2 >> 4);
      local_48 = (uVar2 | uVar2 >> 8) + 1;
      SDL_Log(
             "Forcing FAudio quantum to a power-of-two.\nYou don\'t actually want this, it\'s technically a bug:\nhttps://bugzilla.libsdl.org/show_bug.cgi?id=5136"
             );
    }
  }
  while( true ) {
    if (local_10 == 0) {
      subformat = (FAudioGUID *)0x0;
    }
    else {
      subformat = (FAudioGUID *)SDL_GetAudioDeviceName(local_10 + -1,0);
    }
    local_2c = SDL_OpenAudioDevice(subformat,0,&local_50,local_70,local_7c);
    if (local_2c != 0) break;
    in_stack_ffffffffffffff70 = (FAudioWaveFormatExtensible *)SDL_GetError();
    SDL_Log("OpenAudioDevice failed: %s",in_stack_ffffffffffffff70);
    lVar5 = SDL_strstr(in_stack_ffffffffffffff70);
    if (lVar5 == 0) {
      do {
        iVar3 = SDL_ReportAssertion(&FAudio_PlatformInit::sdl_assert_data_2,"FAudio_PlatformInit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_platform_sdl2.c"
                                    ,0xb7);
      } while (iVar3 == 0);
      if (iVar3 != 1) {
        return;
      }
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  WriteWaveFormatExtensible
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,subformat
            );
  *local_20 = (uint)local_68;
  *local_28 = (ulong)local_2c;
  SDL_PauseAudioDevice(local_2c,0);
  return;
}

Assistant:

void FAudio_PlatformInit(
	FAudio *audio,
	uint32_t flags,
	uint32_t deviceIndex,
	FAudioWaveFormatExtensible *mixFormat,
	uint32_t *updateSize,
	void** platformDevice
) {
	SDL_AudioDeviceID device;
	SDL_AudioSpec want, have;
	const char *driver;
	int changes = 0;

	FAudio_assert(mixFormat != NULL);
	FAudio_assert(updateSize != NULL);

	/* Build the device spec */
	want.freq = mixFormat->Format.nSamplesPerSec;
	want.format = AUDIO_F32;
	want.channels = mixFormat->Format.nChannels;
	want.silence = 0;
	want.callback = FAudio_INTERNAL_MixCallback;
	want.userdata = audio;
	if (flags & FAUDIO_1024_QUANTUM)
	{
		/* Get the sample count for a 21.33ms frame.
		 * For 48KHz this should be 1024.
		 */
		want.samples = (int) (
			want.freq / (1000.0 / (64.0 / 3.0))
		);
	}
	else
	{
		want.samples = want.freq / 100;
	}

	/* FIXME: SDL bug!
	 * The PulseAudio backend does this annoying thing where it halves the
	 * buffer size to prevent latency issues:
	 *
	 * https://hg.libsdl.org/SDL/file/df343364c6c5/src/audio/pulseaudio/SDL_pulseaudio.c#l577
	 *
	 * To get the _actual_ quantum size we want, we just double the buffer
	 * size and allow SDL to set the quantum size back to normal.
	 * -flibit
	 */
	driver = SDL_GetCurrentAudioDriver();
	if (SDL_strcmp(driver, "pulseaudio") == 0)
	{
		want.samples *= 2;
		changes = SDL_AUDIO_ALLOW_SAMPLES_CHANGE;
	}

	/* FIXME: SDL bug!
	 * The most common backends support varying samples values, but many
	 * require a power-of-two value, which XAudio2 is not a fan of.
	 * Normally SDL creates an intermediary stream to handle this, but this
	 * has not been written yet:
	 * https://bugzilla.libsdl.org/show_bug.cgi?id=5136
	 * -flibit
	 */
	else if (	SDL_strcmp(driver, "emscripten") == 0 ||
			SDL_strcmp(driver, "dsp") == 0	)
	{
		want.samples -= 1;
		want.samples |= want.samples >> 1;
		want.samples |= want.samples >> 2;
		want.samples |= want.samples >> 4;
		want.samples |= want.samples >> 8;
		want.samples |= want.samples >> 16;
		want.samples += 1;
		SDL_Log(
			"Forcing FAudio quantum to a power-of-two.\n"
			"You don't actually want this, it's technically a bug:\n"
			"https://bugzilla.libsdl.org/show_bug.cgi?id=5136"
		);
	}

	/* Open the device (or at least try to) */
iosretry:
	device = SDL_OpenAudioDevice(
		deviceIndex > 0 ? SDL_GetAudioDeviceName(deviceIndex - 1, 0) : NULL,
		0,
		&want,
		&have,
		changes
	);
	if (device == 0)
	{
		const char *err = SDL_GetError();
		SDL_Log("OpenAudioDevice failed: %s", err);

		/* iOS has a weird thing where you can't open a stream when the
		 * app is in the background, even though the program is meant
		 * to be suspended and thus not trip this in the first place.
		 *
		 * Startup suspend behavior when an app is opened then closed
		 * is a big pile of crap, basically.
		 *
		 * Google the error code and you'll find that this has been a
		 * long-standing issue that nobody seems to care about.
		 * -flibit
		 */
		if (SDL_strstr(err, "Code=561015905") != NULL)
		{
			goto iosretry;
		}

		FAudio_assert(0 && "Failed to open audio device!");
		return;
	}

	/* Write up the received format for the engine */
	WriteWaveFormatExtensible(
		mixFormat,
		have.channels,
		have.freq,
		&DATAFORMAT_SUBTYPE_IEEE_FLOAT
	);
	*updateSize = have.samples;

	/* SDL_AudioDeviceID is a Uint32, anybody using a 16-bit PC still? */
	*platformDevice = (void*) ((size_t) device);

	/* Start the thread! */
	SDL_PauseAudioDevice(device, 0);
}